

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTest::DeathTest(DeathTest *this)

{
  UnitTestImpl *this_00;
  String local_28;
  TestInfo *local_18;
  TestInfo *info;
  DeathTest *this_local;
  
  this->_vptr_DeathTest = (_func_int **)&PTR__DeathTest_0022c9e0;
  info = (TestInfo *)this;
  this_00 = GetUnitTestImpl();
  local_18 = UnitTestImpl::current_test_info(this_00);
  if (local_18 == (TestInfo *)0x0) {
    String::String(&local_28,"Cannot run a death test outside of a TEST or TEST_F construct");
    DeathTestAbort(&local_28);
    String::~String(&local_28);
  }
  return;
}

Assistant:

DeathTest::DeathTest() {
  TestInfo* const info = GetUnitTestImpl()->current_test_info();
  if (info == NULL) {
    DeathTestAbort("Cannot run a death test outside of a TEST or "
                   "TEST_F construct");
  }
}